

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

extras_type * __thiscall
boost::xpressive::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::get_extras_(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this)

{
  bool bVar1;
  results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prVar2;
  long in_RDI;
  results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffff0;
  
  bVar1 = intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator!((intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(in_RDI + 0x78));
  if (bVar1) {
    operator_new(0x38);
    detail::
    results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::results_extras(in_stack_fffffffffffffff0);
    intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  prVar2 = intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((intrusive_ptr<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(in_RDI + 0x78));
  return prVar2;
}

Assistant:

extras_type &get_extras_()
    {
        if(!this->extras_ptr_)
        {
            this->extras_ptr_ = new extras_type;
        }

        return *this->extras_ptr_;
    }